

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int NET_RecvRaw(int sock,void *buffer,int length)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  char *buf;
  int n;
  int nrecv;
  int length_local;
  void *buffer_local;
  int sock_local;
  
  if (sock < 0) {
    buffer_local._4_4_ = -1;
  }
  else {
    for (buf._4_4_ = 0; buf._4_4_ < length; buf._4_4_ = iVar3 + buf._4_4_) {
      while( true ) {
        sVar1 = recv(sock,(void *)((long)buffer + (long)buf._4_4_),(long)(length - buf._4_4_),0);
        iVar3 = (int)sVar1;
        bVar4 = false;
        if (iVar3 == -1) {
          piVar2 = __errno_location();
          bVar4 = *piVar2 == 4;
        }
        if (!bVar4) break;
        piVar2 = __errno_location();
        *piVar2 = 0;
      }
      if (iVar3 < 0) {
        return iVar3;
      }
      if (iVar3 == 0) break;
    }
    buffer_local._4_4_ = buf._4_4_;
  }
  return buffer_local._4_4_;
}

Assistant:

static int NET_RecvRaw(int sock, void *buffer, int length)
{
  /* Receive exactly length bytes into buffer. Returns number of bytes */
  /* received. Returns -1 in case of error. */


   int nrecv, n;
   char *buf = (char *)buffer;

   if (sock < 0) return -1;
   for (n = 0; n < length; n += nrecv) {
      while ((nrecv = recv(sock, buf+n, length-n, 0)) == -1 && errno == EINTR)
	errno = 0;     /* probably a SIGCLD that was caught */
      if (nrecv < 0)
         return nrecv;
      else if (nrecv == 0)
	break;        /*/ EOF */
   }

   return n;
}